

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O2

bool Assimp::IFC::IntersectsBoundaryProfile
               (IfcVector3 *e0,IfcVector3 *e1,
               vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *boundary,
               bool isStartAssumedInside,
               vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
               *intersect_results,bool halfOpen)

{
  pointer paVar1;
  pointer ppVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  pair<unsigned_long,_aiVector3t<double>_> local_a8;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  
  if ((intersect_results->
      super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (intersect_results->
      super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("intersect_results.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0xfb,
                  "bool Assimp::IFC::IntersectsBoundaryProfile(const IfcVector3 &, const IfcVector3 &, const std::vector<IfcVector3> &, const bool, std::vector<std::pair<size_t, IfcVector3>> &, const bool)"
                 );
  }
  paVar1 = (boundary->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(boundary->
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x18;
  pdVar7 = &paVar1->y;
  dVar8 = 0.0;
  uVar5 = 1;
  while (uVar5 - uVar3 != 1) {
    uVar4 = uVar5;
    if (uVar5 == uVar3) {
      uVar4 = 0;
    }
    uVar5 = uVar5 + 1;
    dVar8 = dVar8 + ((paVar1[uVar5 % uVar3].x - paVar1[uVar4].x) * (paVar1[uVar4].y - *pdVar7) -
                    (paVar1[uVar5 % uVar3].y - paVar1[uVar4].y) *
                    (paVar1[uVar4].x - ((aiVector3t<double> *)(pdVar7 + -1))->x));
    pdVar7 = pdVar7 + 3;
  }
  local_58 = *(double *)(&DAT_005d1140 + (ulong)(0.0 < dVar8) * 8);
  dVar23 = e1->x - e0->x;
  dVar24 = e1->y - e0->y;
  dVar8 = e1->z - e0->z;
  local_48 = -dVar23;
  dStack_40 = -dVar24;
  uStack_50 = 0;
  lVar6 = 0x10;
  local_68 = (double)((ulong)local_58 & 0x8000000000000000) * dVar8;
  uStack_60 = 0;
  uVar5 = 0;
  do {
    if (uVar3 == uVar5) {
      return (intersect_results->
             super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (intersect_results->
             super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    }
    paVar1 = (boundary->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    if (uVar3 - 1 != uVar5) {
      uVar4 = uVar5 + 1;
    }
    dVar14 = *(double *)((long)paVar1 + lVar6 + -0x10);
    dVar22 = *(double *)((long)paVar1 + lVar6 + -8);
    dVar13 = paVar1[uVar4].x - dVar14;
    dVar15 = paVar1[uVar4].y - dVar22;
    dVar9 = dVar23 * dVar15 - dVar13 * dVar24;
    if (1e-06 <= ABS(dVar9)) {
      local_78 = e0->x;
      local_88 = e0->y;
      dVar16 = ((dVar14 - local_78) * dVar24 + (dVar22 - local_88) * local_48) / dVar9;
      dVar9 = ((dVar14 - local_78) * dVar15 + (dVar22 - local_88) * -dVar13) / dVar9;
      dVar10 = dVar9 * dVar23 + local_78;
      dVar11 = dVar9 * dVar24 + local_88;
      dVar17 = (dVar13 * dVar16 + dVar14) - dVar10;
      dVar18 = (dVar15 * dVar16 + dVar22) - dVar11;
      dStack_80 = local_88;
      dStack_70 = local_88;
      if (1e-05 <= dVar17 * dVar17 + dVar18 * dVar18) {
        __assert_fail("(IfcVector2(check.x, check.y)).SquareLength() < 1e-5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCBoolean.cpp"
                      ,0x122,
                      "bool Assimp::IFC::IntersectsBoundaryProfile(const IfcVector3 &, const IfcVector3 &, const std::vector<IfcVector3> &, const bool, std::vector<std::pair<size_t, IfcVector3>> &, const bool)"
                     );
      }
      dVar17 = *(double *)((long)&paVar1->x + lVar6);
      dVar19 = paVar1[uVar4].z - dVar17;
      dVar18 = 1.0 / (dVar19 * dVar19 + dVar13 * dVar13 + dVar15 * dVar15);
      dVar20 = ((e1->x - dVar14) * dVar13 + (e1->y - dVar22) * dVar15) * dVar18;
      if (1.0 <= dVar20) {
        dVar20 = 1.0;
      }
      if (dVar20 <= 0.0) {
        dVar20 = 0.0;
      }
      dVar21 = dVar20 * dVar19 + dVar17;
      dVar12 = (dVar13 * dVar20 + dVar14) - e1->x;
      dVar20 = (dVar15 * dVar20 + dVar22) - e1->y;
      if (1e-12 <= dVar21 * dVar21 + dVar12 * dVar12 + dVar20 * dVar20 || halfOpen) {
        dVar20 = ((local_78 - dVar14) * dVar13 + (local_88 - dVar22) * dVar15) * dVar18;
        if (1.0 <= dVar20) {
          dVar20 = 1.0;
        }
        if (dVar20 <= 0.0) {
          dVar20 = 0.0;
        }
        dVar17 = dVar17 + dVar19 * dVar20;
        dVar14 = (dVar13 * dVar20 + dVar14) - local_78;
        dVar22 = (dVar20 * dVar15 + dVar22) - local_88;
        if (1e-12 <= dVar17 * dVar17 + dVar14 * dVar14 + dVar22 * dVar22) {
          if ((((dVar18 * -1e-06 <= dVar16) && (dVar16 <= dVar18 * 1e-06 + 1.0)) && (0.0 <= dVar9))
             && (dVar9 <= 1.0 || halfOpen)) {
            dVar14 = dVar9 * dVar8 + e0->z;
            ppVar2 = (intersect_results->
                     super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if ((((intersect_results->
                  super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == ppVar2) ||
                (uVar5 - 1 != ppVar2[-1].first)) ||
               (dVar22 = ppVar2[-1].second.x - dVar10, dVar9 = ppVar2[-1].second.y - dVar11,
               1e-10 <= dVar22 * dVar22 + dVar9 * dVar9)) goto LAB_004daeca;
          }
        }
        else if ((dVar15 * local_58 * dVar23 + -dVar13 * local_58 * dVar24 + local_68 <= 0.0 ==
                  isStartAssumedInside) &&
                (((ppVar2 = (intersect_results->
                            super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish,
                  (intersect_results->
                  super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == ppVar2 ||
                  (uVar5 - 1 != ppVar2[-1].first)) ||
                 (dVar14 = ppVar2[-1].second.x - local_78, dVar22 = ppVar2[-1].second.y - local_88,
                 1e-10 <= dVar14 * dVar14 + dVar22 * dVar22)))) {
          dVar10 = e0->x;
          dVar11 = e0->y;
          dVar14 = e0->z;
LAB_004daeca:
          local_a8.second.z = dVar14;
          local_a8.second.y = dVar11;
          local_a8.second.x = dVar10;
          local_a8.first = uVar5;
          std::
          vector<std::pair<unsigned_long,aiVector3t<double>>,std::allocator<std::pair<unsigned_long,aiVector3t<double>>>>
          ::emplace_back<std::pair<unsigned_long,aiVector3t<double>>>
                    ((vector<std::pair<unsigned_long,aiVector3t<double>>,std::allocator<std::pair<unsigned_long,aiVector3t<double>>>>
                      *)intersect_results,&local_a8);
        }
      }
    }
    lVar6 = lVar6 + 0x18;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool IntersectsBoundaryProfile(const IfcVector3& e0, const IfcVector3& e1, const std::vector<IfcVector3>& boundary,
    const bool isStartAssumedInside, std::vector<std::pair<size_t, IfcVector3> >& intersect_results,
    const bool halfOpen = false)
{
    ai_assert(intersect_results.empty());

    // determine winding order - necessary to detect segments going "inwards" or "outwards" from a point directly on the border
    // positive sum of angles means clockwise order when looking down the -Z axis
    IfcFloat windingOrder = 0.0;
    for( size_t i = 0, bcount = boundary.size(); i < bcount; ++i ) {
        IfcVector3 b01 = boundary[(i + 1) % bcount] - boundary[i];
        IfcVector3 b12 = boundary[(i + 2) % bcount] - boundary[(i + 1) % bcount];
        IfcVector3 b1_side = IfcVector3(b01.y, -b01.x, 0.0); // rotated 90° clockwise in Z plane
        // Warning: rough estimate only. A concave poly with lots of small segments each featuring a small counter rotation
        // could fool the accumulation. Correct implementation would be sum( acos( b01 * b2) * sign( b12 * b1_side))
        windingOrder += (b1_side.x*b12.x + b1_side.y*b12.y);
    }
    windingOrder = windingOrder > 0.0 ? 1.0 : -1.0;

    const IfcVector3 e = e1 - e0;

    for( size_t i = 0, bcount = boundary.size(); i < bcount; ++i ) {
        // boundary segment i: b0-b1
        const IfcVector3& b0 = boundary[i];
        const IfcVector3& b1 = boundary[(i + 1) % bcount];
        IfcVector3 b = b1 - b0;

        // segment-segment intersection
        // solve b0 + b*s = e0 + e*t for (s,t)
        const IfcFloat det = (-b.x * e.y + e.x * b.y);
        if( std::abs(det) < 1e-6 ) {
            // no solutions (parallel lines)
            continue;
        }
        IfcFloat b_sqlen_inv = 1.0 / b.SquareLength();

        const IfcFloat x = b0.x - e0.x;
        const IfcFloat y = b0.y - e0.y;
        const IfcFloat s = (x*e.y - e.x*y) / det; // scale along boundary edge
        const IfcFloat t = (x*b.y - b.x*y) / det; // scale along given segment
        const IfcVector3 p = e0 + e*t;
#ifdef ASSIMP_BUILD_DEBUG
        const IfcVector3 check = b0 + b*s - p;
        ai_assert((IfcVector2(check.x, check.y)).SquareLength() < 1e-5);
#endif

        // also calculate the distance of e0 and e1 to the segment. We need to detect the "starts directly on segment"
        // and "ends directly at segment" cases
        bool startsAtSegment, endsAtSegment;
        {
            // calculate closest point to each end on the segment, clamp that point to the segment's length, then check
            // distance to that point. This approach is like testing if e0 is inside a capped cylinder.
            IfcFloat et0 = (b.x*(e0.x - b0.x) + b.y*(e0.y - b0.y)) * b_sqlen_inv;
            IfcVector3 closestPosToE0OnBoundary = b0 + std::max(IfcFloat(0.0), std::min(IfcFloat(1.0), et0)) * b;
            startsAtSegment = (closestPosToE0OnBoundary - IfcVector3(e0.x, e0.y, 0.0)).SquareLength() < 1e-12;
            IfcFloat et1 = (b.x*(e1.x - b0.x) + b.y*(e1.y - b0.y)) * b_sqlen_inv;
            IfcVector3 closestPosToE1OnBoundary = b0 + std::max(IfcFloat(0.0), std::min(IfcFloat(1.0), et1)) * b;
            endsAtSegment = (closestPosToE1OnBoundary - IfcVector3(e1.x, e1.y, 0.0)).SquareLength() < 1e-12;
        }

        // Line segment ends at boundary -> ignore any hit, it will be handled by possibly following segments
        if( endsAtSegment && !halfOpen )
            continue;

        // Line segment starts at boundary -> generate a hit only if following that line would change the INSIDE/OUTSIDE
        // state. This should catch the case where a connected set of segments has a point directly on the boundary,
        // one segment not hitting it because it ends there and the next segment not hitting it because it starts there
        // Should NOT generate a hit if the segment only touches the boundary but turns around and stays inside.
        if( startsAtSegment )
        {
            IfcVector3 inside_dir = IfcVector3(b.y, -b.x, 0.0) * windingOrder;
            bool isGoingInside = (inside_dir * e) > 0.0;
            if( isGoingInside == isStartAssumedInside )
                continue;

            // only insert the point into the list if it is sufficiently far away from the previous intersection point.
            // This way, we avoid duplicate detection if the intersection is directly on the vertex between two segments.
            if( !intersect_results.empty() && intersect_results.back().first == i - 1 )
            {
                const IfcVector3 diff = intersect_results.back().second - e0;
                if( IfcVector2(diff.x, diff.y).SquareLength() < 1e-10 )
                    continue;
            }
            intersect_results.push_back(std::make_pair(i, e0));
            continue;
        }

        // for a valid intersection, s and t should be in range [0,1]. Including a bit of epsilon on s, potential double
        // hits on two consecutive boundary segments are filtered
        if( s >= -1e-6 * b_sqlen_inv && s <= 1.0 + 1e-6*b_sqlen_inv && t >= 0.0 && (t <= 1.0 || halfOpen) )
        {
            // only insert the point into the list if it is sufficiently far away from the previous intersection point.
            // This way, we avoid duplicate detection if the intersection is directly on the vertex between two segments.
            if( !intersect_results.empty() && intersect_results.back().first == i - 1 )
            {
                const IfcVector3 diff = intersect_results.back().second - p;
                if( IfcVector2(diff.x, diff.y).SquareLength() < 1e-10 )
                    continue;
            }
            intersect_results.push_back(std::make_pair(i, p));
        }
    }

    return !intersect_results.empty();
}